

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O3

void connection(string ip,uint port,bool *running_flag,RobotKuka *robotKuka)

{
  undefined8 *puVar1;
  Pose move;
  Axes rotate;
  DigitalOutputs DVar2;
  int __fd;
  int iVar3;
  uint uVar4;
  char *xml_send;
  ssize_t sVar5;
  long in_RCX;
  DigitalOutputs digout;
  socklen_t sendsize;
  Pose pose;
  sockaddr_in clientaddr;
  Axes axis;
  string xml_receive;
  Data data;
  DigitalOutputs local_2cc;
  socklen_t local_2c8;
  int local_2c4;
  RobotKuka *local_2c0;
  long local_2b8;
  deque<Pose,_std::allocator<Pose>_> *local_2b0;
  Pose local_2a8;
  sockaddr local_288;
  Axes local_278;
  Pose local_258;
  Axes local_240;
  string local_228;
  sockaddr local_208;
  Data local_1f8;
  Data local_114;
  
  local_2c0 = robotKuka;
  local_2b8 = in_RCX;
  __fd = socket(2,2,0);
  if (__fd < 0) {
    perror("socket failed");
  }
  local_208.sa_data[6] = '\0';
  local_208.sa_data[7] = '\0';
  local_208.sa_data[8] = '\0';
  local_208.sa_data[9] = '\0';
  local_208.sa_data[10] = '\0';
  local_208.sa_data[0xb] = '\0';
  local_208.sa_data[0xc] = '\0';
  local_208.sa_data[0xd] = '\0';
  local_208.sa_family = 2;
  local_208.sa_data._0_2_ = (ushort)running_flag << 8 | (ushort)running_flag >> 8;
  local_208.sa_data[2] = '\0';
  local_208.sa_data[3] = '\0';
  local_208.sa_data[4] = '\0';
  local_208.sa_data[5] = '\0';
  local_2c8 = 0x10;
  local_288.sa_family = 0;
  local_288.sa_data[0] = '\0';
  local_288.sa_data[1] = '\0';
  local_288.sa_data[2] = '\0';
  local_288.sa_data[3] = '\0';
  local_288.sa_data[4] = '\0';
  local_288.sa_data[5] = '\0';
  local_288.sa_data[6] = '\0';
  local_288.sa_data[7] = '\0';
  local_288.sa_data[8] = '\0';
  local_288.sa_data[9] = '\0';
  local_288.sa_data[10] = '\0';
  local_288.sa_data[0xb] = '\0';
  local_288.sa_data[0xc] = '\0';
  local_288.sa_data[0xd] = '\0';
  iVar3 = bind(__fd,&local_208,0x10);
  if (iVar3 < 0) {
    perror("bind failed");
  }
  if (*(char *)&local_2c0->CYCLE_TIME == '\x01') {
    local_2b0 = (deque<Pose,_std::allocator<Pose>_> *)(local_2b8 + 8);
    local_2c4 = __fd;
    do {
      xml_send = (char *)malloc(0x800);
      sVar5 = recvfrom(__fd,xml_send,0x800,0,&local_288,&local_2c8);
      uVar4 = (uint)sVar5;
      if ((int)uVar4 < 0) {
        perror("recvfrom failed");
        break;
      }
      xml_send[uVar4 & 0x7fffffff] = '\0';
      Data::Data(&local_114);
      xml_handler::get_data_from_xml_send(&local_1f8,xml_send,uVar4);
      memcpy(&local_114,&local_1f8,0xe4);
      local_1f8.r_ist._0_8_ = (long)&local_1f8 + 0x10;
      local_1f8.r_ist.z = 0.0;
      local_1f8.r_ist.a = 0.0;
      local_1f8.r_ist.b._0_1_ = 0;
      Pose::Pose(&local_2a8);
      Axes::Axes(&local_240);
      DigitalOutputs::DigitalOutputs(&local_2cc);
      puVar1 = *(undefined8 **)(local_2b8 + 0x18);
      if (*(undefined8 **)(local_2b8 + 0x38) != puVar1) {
        local_2a8._16_8_ = puVar1[2];
        local_2a8._0_8_ = *puVar1;
        local_2a8._8_8_ = puVar1[1];
        std::deque<Pose,_std::allocator<Pose>_>::pop_front(local_2b0);
      }
      DVar2 = local_2cc;
      local_258.x = local_2a8.x;
      local_258.y = local_2a8.y;
      local_258.z = local_2a8.z;
      local_258.a = local_2a8.a;
      local_258.b = local_2a8.b;
      local_258.c = local_2a8.c;
      local_278.a1 = local_240.a1;
      local_278.a2 = local_240.a2;
      local_278.a3 = local_240.a3;
      local_278.a4 = local_240.a4;
      local_278.a5 = local_240.a5;
      local_278.a6 = local_240.a6;
      uVar4 = Data::get_ipoc(&local_114);
      move.z = local_258.z;
      move.a = local_258.a;
      move.x = local_258.x;
      move.y = local_258.y;
      move.b = local_258.b;
      move.c = local_258.c;
      rotate.a3 = local_278.a3;
      rotate.a4 = local_278.a4;
      rotate.a1 = local_278.a1;
      rotate.a2 = local_278.a2;
      rotate.a5 = local_278.a5;
      rotate.a6 = local_278.a6;
      xml_handler::generate_xml_receive_abi_cxx11_
                (&local_228,(xml_handler *)(ulong)(uint3)DVar2,move,rotate,SUB43(uVar4,0),
                 (uint)local_258.b);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      __fd = local_2c4;
      sendto(local_2c4,(void *)local_1f8.r_ist._0_8_,local_1f8.r_ist._8_8_,0,&local_288,local_2c8);
      free(xml_send);
      if ((void *)local_1f8.r_ist._0_8_ != (void *)((long)&local_1f8 + 0x10U)) {
        operator_delete((void *)local_1f8.r_ist._0_8_);
      }
    } while (*(char *)&local_2c0->CYCLE_TIME != '\0');
  }
  close(__fd);
  pthread_exit((void *)0x0);
}

Assistant:

void connection(std::string ip, unsigned int port, bool* running_flag, RobotKuka* robotKuka)
{	
	#define EXPR_SIZE   2048
	#define BUFLEN      2048
	#define TRUE        1
	#define SERVERLEN   2048

	int fd;

    if ((fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        perror( "socket failed" );
    }

    struct sockaddr_in serveraddr;
    memset( &serveraddr, 0, sizeof(serveraddr) );
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_port = htons( port );
    serveraddr.sin_addr.s_addr = htonl( INADDR_ANY );

	struct sockaddr_in clientaddr;
    socklen_t sendsize = sizeof(clientaddr);
	bzero(&clientaddr, sizeof(clientaddr));


    if (bind(fd, (struct sockaddr *)&serveraddr, sizeof(serveraddr)) < 0) {
        perror( "bind failed" );
    }


	while (*running_flag)
	{
		char* xml_send = (char*)malloc(sizeof(char) * 2048);

		int length = recvfrom(fd, xml_send, sizeof(char) * 2048 , 0, (struct sockaddr *) &clientaddr, &sendsize );
        if ( length < 0 ) {
            perror( "recvfrom failed" );
            break;
        }

        /* Starts chrono to account CYCLE TIME */
		//auto started = std::chrono::high_resolution_clock::now();

		//std::cout << "Msg len: " << length << std::endl;

		xml_send[length] = '\0';  // This is necessary to avoid xml_parse errors;

		/* Gets all data read from received XML Send and puts it into a instance of Data. */
		Data data;
		data = xml_handler::get_data_from_xml_send(const_cast<char*>(xml_send), length);

		//data.get_r_ist().print();
		//std::cout << data.get_delay() << std::endl;

		//data.print();

		std::string xml_receive;  // creates string for XML Receive

		/* Creates void instances of pose, axis and digital outputs to send thru XML Receive. */
		Pose pose = Pose();
		Axes axis = Axes();
		DigitalOutputs digout = DigitalOutputs();

		/* Push one element from the queue if the movement queue is not empty. If the queue is empty,
		the void instances are placed. */
		if (!robotKuka->move_queue.empty())
		{
			pose = robotKuka->move_queue.front();
			robotKuka->move_queue.pop();
		}

		/* Generates the XML Receive string using the pose, axis, and digital outputs instances and
		the previous XML Send IPOC value. */
    	xml_receive = xml_handler::generate_xml_receive(pose, axis, digout, data.get_ipoc());

    	/* Sends the XML Receive string thru the socket created previously. */
		int send_status = sendto(fd, xml_receive.c_str(), xml_receive.length()*sizeof(char), 0, (struct sockaddr *) &clientaddr, 
								 sendsize);

		/* Free the allocated space for XML Send string. */
		free(xml_send);  // might be a bottleneck <!>

		/* Stops chrono to account CYCLE TIME. */
		//auto done = std::chrono::high_resolution_clock::now();
		//std::cout << "Time: " << std::chrono::duration_cast<std::chrono::nanoseconds>(done-started).count();
	}


	/* Closes the previously openned communication socket. */
    close(fd);

    /* Exits the previously created communication thread. */
	pthread_exit(NULL);
	exit(0);
}